

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cc
# Opt level: O1

void cnn::Cleanup(void)

{
  if (rndeng != (void *)0x0) {
    operator_delete(rndeng);
  }
  if (fxs != (void *)0x0) {
    operator_delete(fxs);
  }
  if (dEdfs != (void *)0x0) {
    operator_delete(dEdfs);
  }
  if (ps != (void *)0x0) {
    operator_delete(ps);
    return;
  }
  return;
}

Assistant:

void Cleanup() {
  delete rndeng;
  delete fxs;
  delete dEdfs;
  delete ps;
}